

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

ssize_t archive_write_pax_data(archive_write *a,void *buff,size_t s)

{
  long lVar1;
  int iVar2;
  ulong in_RDX;
  long in_RDI;
  bool bVar3;
  sparse_block_conflict *sb;
  uchar *p;
  int ret;
  size_t total;
  size_t ws;
  pax *pax;
  uint7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  archive_write *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffc0;
  archive_write *in_stack_ffffffffffffffc8;
  ulong uVar4;
  ulong local_30;
  
  lVar1 = *(long *)(in_RDI + 0xd0);
  if (*(long *)(lVar1 + 0x48) != 0) {
    iVar2 = __archive_write_output
                      (in_stack_ffffffffffffffb0,
                       (void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                       0x189b2c);
    if (iVar2 != 0) {
      return (long)iVar2;
    }
    iVar2 = __archive_write_nulls(in_stack_ffffffffffffffc8,(ulong)in_stack_ffffffffffffffc0);
    if (iVar2 != 0) {
      return (long)iVar2;
    }
    *(undefined8 *)(lVar1 + 0x48) = 0;
  }
  uVar4 = 0;
  while( true ) {
    if (in_RDX <= uVar4) {
      return uVar4;
    }
    while( true ) {
      bVar3 = false;
      if (*(long *)(lVar1 + 0x60) != 0) {
        bVar3 = *(long *)(*(long *)(lVar1 + 0x60) + 0x18) == 0;
      }
      if (!bVar3) break;
      in_stack_ffffffffffffffb0 = (archive_write *)**(undefined8 **)(lVar1 + 0x60);
      free(*(void **)(lVar1 + 0x60));
      *(archive_write **)(lVar1 + 0x60) = in_stack_ffffffffffffffb0;
    }
    if (*(long *)(lVar1 + 0x60) == 0) break;
    local_30 = in_RDX - uVar4;
    if (*(ulong *)(*(long *)(lVar1 + 0x60) + 0x18) < local_30) {
      local_30 = *(ulong *)(*(long *)(lVar1 + 0x60) + 0x18);
    }
    if (*(int *)(*(long *)(lVar1 + 0x60) + 8) == 0) {
      iVar2 = __archive_write_output
                        (in_stack_ffffffffffffffb0,(void *)(ulong)in_stack_ffffffffffffffa8,0x189caa
                        );
      *(ulong *)(*(long *)(lVar1 + 0x60) + 0x18) =
           *(long *)(*(long *)(lVar1 + 0x60) + 0x18) - local_30;
      uVar4 = local_30 + uVar4;
      if (iVar2 != 0) {
        return (long)iVar2;
      }
    }
    else {
      *(ulong *)(*(long *)(lVar1 + 0x60) + 0x18) =
           *(long *)(*(long *)(lVar1 + 0x60) + 0x18) - local_30;
      uVar4 = local_30 + uVar4;
    }
  }
  return uVar4;
}

Assistant:

static ssize_t
archive_write_pax_data(struct archive_write *a, const void *buff, size_t s)
{
	struct pax *pax;
	size_t ws;
	size_t total;
	int ret;

	pax = (struct pax *)a->format_data;

	/*
	 * According to GNU PAX format 1.0, write a sparse map
	 * before the body.
	 */
	if (archive_strlen(&(pax->sparse_map))) {
		ret = __archive_write_output(a, pax->sparse_map.s,
		    archive_strlen(&(pax->sparse_map)));
		if (ret != ARCHIVE_OK)
			return (ret);
		ret = __archive_write_nulls(a, pax->sparse_map_padding);
		if (ret != ARCHIVE_OK)
			return (ret);
		archive_string_empty(&(pax->sparse_map));
	}

	total = 0;
	while (total < s) {
		const unsigned char *p;

		while (pax->sparse_list != NULL &&
		    pax->sparse_list->remaining == 0) {
			struct sparse_block *sb = pax->sparse_list->next;
			free(pax->sparse_list);
			pax->sparse_list = sb;
		}

		if (pax->sparse_list == NULL)
			return (total);

		p = ((const unsigned char *)buff) + total;
		ws = s - total;
		if (ws > pax->sparse_list->remaining)
			ws = (size_t)pax->sparse_list->remaining;

		if (pax->sparse_list->is_hole) {
			/* Current block is hole thus we do not write
			 * the body. */
			pax->sparse_list->remaining -= ws;
			total += ws;
			continue;
		}

		ret = __archive_write_output(a, p, ws);
		pax->sparse_list->remaining -= ws;
		total += ws;
		if (ret != ARCHIVE_OK)
			return (ret);
	}
	return (total);
}